

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<ParamsStream<VectorWriter&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<VectorWriter_&,_TransactionSerParams> *s,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *v)

{
  long lVar1;
  bool bVar2;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_RSI;
  long in_FS_OFFSET;
  value_type *elem;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range2;
  DefaultFormatter formatter;
  const_iterator __end0;
  const_iterator __begin0;
  ParamsStream<VectorWriter_&,_TransactionSerParams> *in_stack_ffffffffffffffa8;
  ParamsStream<VectorWriter_&,_TransactionSerParams> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_ffffffffffffffa8);
  WriteCompactSize<ParamsStream<VectorWriter&,TransactionSerParams>>
            (in_stack_ffffffffffffffb8,(uint64_t)in_RSI);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::begin(in_RSI);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                      ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        *)in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        *)in_RSI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         (ParamsStream<VectorWriter_&,_TransactionSerParams> *)
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
         ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                      *)in_stack_ffffffffffffffa8);
    DefaultFormatter::
    Ser<ParamsStream<VectorWriter&,TransactionSerParams>,std::shared_ptr<CTransaction_const>>
              (in_stack_ffffffffffffffa8,(shared_ptr<const_CTransaction> *)0x326143);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }